

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O1

void __thiscall JSON::JSON_string::JSON_string(JSON_string *this,string *utf8)

{
  pointer pcVar1;
  
  (this->super_JSON_value).type_code = vt_string;
  (this->super_JSON_value)._vptr_JSON_value = (_func_int **)&PTR__JSON_string_002ede20;
  (this->utf8)._M_dataplus._M_p = (pointer)&(this->utf8).field_2;
  pcVar1 = (utf8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->utf8,pcVar1,pcVar1 + utf8->_M_string_length);
  return;
}

Assistant:

JSON_value(value_type_e type_code) :
            type_code(type_code)
        {
        }